

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_3dmidtex.cpp
# Opt level: O3

void P_Start3dMidtexInterpolations
               (TArray<DInterpolation_*,_DInterpolation_*> *list,sector_t *sector,bool ceiling)

{
  uint uVar1;
  extsector_t *peVar2;
  long lVar3;
  DInterpolation *pDVar4;
  undefined3 in_register_00000011;
  ulong uVar5;
  ulong uVar6;
  
  peVar2 = sector->e;
  uVar5 = (ulong)(uint)(CONCAT31(in_register_00000011,ceiling) << 5);
  if (*(int *)((long)&(peVar2->Midtex).Floor.AttachedLines.Count + uVar5) != 0) {
    uVar5 = uVar5 | 0x10;
    uVar6 = 0;
    do {
      lVar3 = *(long *)(*(long *)((long)&(peVar2->Midtex).Floor.AttachedSectors.Array + uVar5) +
                       uVar6 * 8);
      pDVar4 = side_t::SetInterpolation(*(side_t **)(lVar3 + 0x48),1);
      TArray<DInterpolation_*,_DInterpolation_*>::Grow(list,1);
      uVar1 = list->Count;
      list->Array[uVar1] = pDVar4;
      list->Count = uVar1 + 1;
      pDVar4 = side_t::SetInterpolation(*(side_t **)(lVar3 + 0x50),1);
      TArray<DInterpolation_*,_DInterpolation_*>::Grow(list,1);
      uVar1 = list->Count;
      list->Array[uVar1] = pDVar4;
      list->Count = uVar1 + 1;
      uVar6 = uVar6 + 1;
    } while (uVar6 < *(uint *)((long)&(peVar2->Midtex).Floor.AttachedSectors.Count + uVar5));
  }
  return;
}

Assistant:

void P_Start3dMidtexInterpolations(TArray<DInterpolation *> &list, sector_t *sector, bool ceiling)
{
	extsector_t::midtex::plane &scrollplane = ceiling? sector->e->Midtex.Ceiling : sector->e->Midtex.Floor;

	for(unsigned i = 0; i < scrollplane.AttachedLines.Size(); i++)
	{
		line_t *l = scrollplane.AttachedLines[i];

		list.Push(l->sidedef[0]->SetInterpolation(side_t::mid));
		list.Push(l->sidedef[1]->SetInterpolation(side_t::mid));
	}
}